

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_includes(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue val_00;
  JSValue obj_00;
  JSValue op2;
  JSValue op2_00;
  JSValue op1;
  JSValue op1_00;
  JSValue val_01;
  JSValue obj_01;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  int in_ECX;
  JSValueUnion in_RDI;
  JSValue *in_R8;
  JSValue JVar5;
  uint32_t count;
  JSValue *arrp;
  int64_t res;
  int64_t n;
  int64_t len;
  JSValue val;
  JSValue obj;
  JSValueUnion in_stack_ffffffffffffff00;
  JSValueUnion in_stack_ffffffffffffff08;
  JSValueUnion in_stack_ffffffffffffff10;
  int64_t *in_stack_ffffffffffffff18;
  JSContext *in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  JSContext *in_stack_ffffffffffffff30;
  JSValueUnion in_stack_ffffffffffffff38;
  JSValueUnion in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  JSStrictEqModeEnum in_stack_ffffffffffffff4c;
  JSValueUnion ctx_00;
  int64_t iVar6;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  JSValue *in_stack_ffffffffffffff68;
  undefined4 uVar7;
  long local_88;
  long local_80;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  JSValueUnion JVar8;
  int64_t in_stack_ffffffffffffffa0;
  int64_t iVar9;
  uint local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  val_01.tag = in_stack_ffffffffffffffa0;
  val_01.u.float64 = in_stack_ffffffffffffff98.float64;
  JVar5 = JS_ToObject(in_stack_ffffffffffffff90,val_01);
  ctx_00 = JVar5.u;
  iVar6 = JVar5.tag;
  JVar5.tag = (int64_t)in_stack_ffffffffffffff30;
  JVar5.u.ptr = in_stack_ffffffffffffff28.ptr;
  JVar8 = ctx_00;
  iVar9 = iVar6;
  iVar2 = js_get_length64(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,JVar5);
  if (iVar2 == 0) {
    iVar2 = 0;
    uVar7 = 0;
    if (0 < local_80) {
      local_88 = 0;
      if ((1 < in_ECX) &&
         (val_00.tag = (int64_t)in_stack_ffffffffffffff40.ptr,
         val_00.u.float64 = in_stack_ffffffffffffff38.float64,
         iVar3 = JS_ToInt64Clamp(in_stack_ffffffffffffff30,(int64_t *)in_stack_ffffffffffffff28.ptr,
                                 val_00,(int64_t)in_stack_ffffffffffffff20,
                                 (int64_t)in_stack_ffffffffffffff18,(int64_t)ctx_00), iVar3 != 0))
      goto LAB_00149d2c;
      obj_01.tag = iVar9;
      obj_01.u.float64 = JVar8.float64;
      BVar4 = js_get_fast_array((JSContext *)in_RDI.ptr,obj_01,(JSValue **)&stack0xffffffffffffff68,
                                (uint32_t *)&stack0xffffffffffffff64);
      if (BVar4 != 0) {
        for (; local_88 < (long)(ulong)in_stack_ffffffffffffff64; local_88 = local_88 + 1) {
          in_stack_ffffffffffffff08 = in_RDI;
          JVar5 = JS_DupValue((JSContext *)in_RDI.ptr,*in_R8);
          in_stack_ffffffffffffff40 = JVar5.u;
          in_stack_ffffffffffffff48 = (undefined4)JVar5.tag;
          in_stack_ffffffffffffff4c = JVar5.tag._4_4_;
          JVar5 = JS_DupValue((JSContext *)in_RDI.ptr,in_stack_ffffffffffffff68[local_88]);
          in_stack_ffffffffffffff38 = (JSValueUnion)JVar5.tag;
          op1.tag._0_4_ = iVar2;
          op1.u.ptr = in_stack_ffffffffffffff68;
          op1.tag._4_4_ = uVar7;
          op2.tag._0_4_ = in_stack_ffffffffffffff60;
          op2.u = (JSValueUnion)iVar6;
          op2.tag._4_4_ = in_stack_ffffffffffffff64;
          BVar4 = js_strict_eq2((JSContext *)ctx_00.ptr,op1,op2,in_stack_ffffffffffffff4c);
          if (BVar4 != 0) {
            iVar2 = 1;
            goto LAB_00149cb0;
          }
        }
      }
      for (; local_88 < local_80; local_88 = local_88 + 1) {
        obj_00.u._4_4_ = in_stack_ffffffffffffff4c;
        obj_00.u.int32 = in_stack_ffffffffffffff48;
        obj_00.tag = (int64_t)ctx_00.ptr;
        JVar5 = JS_GetPropertyInt64((JSContext *)in_stack_ffffffffffffff40.ptr,obj_00,
                                    (int64_t)in_stack_ffffffffffffff38);
        iVar3 = JS_IsException(JVar5);
        if (iVar3 != 0) goto LAB_00149d2c;
        in_stack_ffffffffffffff00 = in_RDI;
        JVar5 = JS_DupValue((JSContext *)in_RDI.ptr,*in_R8);
        in_stack_ffffffffffffff10 = JVar5.u;
        op1_00.tag._0_4_ = iVar2;
        op1_00.u = (JSValueUnion)in_stack_ffffffffffffff68;
        op1_00.tag._4_4_ = uVar7;
        op2_00.tag._0_4_ = in_stack_ffffffffffffff60;
        op2_00.u = (JSValueUnion)iVar6;
        op2_00.tag._4_4_ = in_stack_ffffffffffffff64;
        BVar4 = js_strict_eq2((JSContext *)ctx_00.ptr,op1_00,op2_00,in_stack_ffffffffffffff4c);
        if (BVar4 != 0) {
          iVar2 = 1;
          break;
        }
      }
    }
LAB_00149cb0:
    v.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
    v.u.ptr = in_stack_ffffffffffffff08.ptr;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff00.ptr,v);
    local_30 = (uint)(iVar2 != 0);
    uStack_2c = uStack_c;
    local_28 = 1;
  }
  else {
LAB_00149d2c:
    v_00.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
    v_00.u.ptr = in_stack_ffffffffffffff08.ptr;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff00.ptr,v_00);
    local_30 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_array_includes(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = FALSE;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]),
                                  JS_EQ_SAME_VALUE_ZERO)) {
                    res = TRUE;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            val = JS_GetPropertyInt64(ctx, obj, n);
            if (JS_IsException(val))
                goto exception;
            if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val,
                              JS_EQ_SAME_VALUE_ZERO)) {
                res = TRUE;
                break;
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}